

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofilebinconv.cpp
# Opt level: O1

void fmprofilebinconv::doit(void)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  fm_profile f;
  fm_profile_old q;
  undefined1 local_88 [8];
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined1 local_60 [4];
  undefined4 local_5c;
  uint local_50;
  uint local_4c;
  undefined4 uStack_48;
  uint local_44;
  uint local_40;
  uint local_34;
  
  sVar1 = fread(local_60,0x30,1,_stdin);
  if (sVar1 != 0) {
    do {
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uVar2 = local_4c;
      switch(local_5c) {
      case 1:
      case 3:
        uVar2 = local_50;
        uVar3 = local_4c;
        goto LAB_00101437;
      case 2:
        uStack_80 = (ulong)local_50;
        uStack_70 = CONCAT44(uStack_48,local_4c);
        break;
      default:
        fprintf(_stderr,"Unknown calcrule_id %d\n");
        break;
      case 5:
        uVar2 = local_44;
        uVar3 = local_40;
LAB_00101437:
        uStack_80 = (ulong)uVar2;
        uStack_70 = (ulong)uVar3;
        break;
      case 9:
        uStack_80 = (ulong)local_34;
        goto LAB_0010147f;
      case 10:
        local_78 = (ulong)local_50;
        break;
      case 0xb:
        uStack_80 = (ulong)local_50 << 0x20;
        break;
      case 0xc:
        uVar2 = local_50;
        goto LAB_0010148d;
      case 0xe:
        goto LAB_0010147f;
      case 0xf:
        uVar2 = local_40;
LAB_0010147f:
        uStack_70 = (ulong)uVar2;
        break;
      case 0x10:
        uVar2 = local_44;
LAB_0010148d:
        uStack_80 = (ulong)uVar2;
      }
      local_78 = local_78 & 0xffffffff;
      fwrite(local_88,0x28,1,_stdout);
      sVar1 = fread(local_60,0x30,1,_stdin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void doit() {

        fm_profile_old q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            fm_profile f;
            f.profile_id = q.policytc_id;
            f.calcrule_id = q.calcrule_id;
            switch (f.calcrule_id) {
            case 1:
            case 3: {
                f.deductible1 = q.deductible;
                f.limit = q.limits;
            } break;
            case 2: {
                f.deductible1 = q.deductible;
                f.limit = q.limits;
                f.share1 = q.share_prop_of_lim;
            } break;
            case 5: {
                f.deductible1 = q.deductible_prop_of_loss;
                f.limit = q.limit_prop_of_loss;
            } break;
            case 9: {
                f.deductible1 = q.deductible_prop_of_limit;
                f.limit = q.limits;
            } break;
            case 10: {
                f.deductible3 = q.deductible;
            } break;
            case 11: {
                f.deductible2 = q.deductible;
            } break;
            case 12: {
                f.deductible1 = q.deductible;
            } break;
            case 14: {
                f.limit = q.limits;
            } break;
            case 15: {
                f.limit = q.limit_prop_of_loss;
            } break;
            case 16: {
                f.deductible1 = q.deductible_prop_of_loss;
            } break;
            default:
                fprintf(stderr, "Unknown calcrule_id %d\n", q.calcrule_id);
            }

            f.attachment = 0;

            fwrite(&f, sizeof(f), 1, stdout);
            i = fread(&q, sizeof(q), 1, stdin);
        }
    }